

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taskflow.hpp
# Opt level: O1

void __thiscall tf::Taskflow::_dump(Taskflow *this,ostream *os,Graph *graph,Dumper *dumper)

{
  Node *node;
  size_type sVar1;
  __node_base_ptr p_Var2;
  _Hash_node_base *p_Var3;
  mapped_type mVar4;
  ostream *poVar5;
  __node_base_ptr p_Var6;
  mapped_type *pmVar7;
  ulong uVar8;
  __node_base_ptr p_Var9;
  ulong uVar10;
  Graph *module;
  key_type local_78;
  pair<const_tf::Node_*,_const_tf::Graph_*> local_70;
  _Map_base<const_tf::Graph_*,_std::pair<const_tf::Graph_*const,_unsigned_long>,_std::allocator<std::pair<const_tf::Graph_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_tf::Graph_*>,_std::hash<const_tf::Graph_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_60;
  deque<std::pair<tf::Node_const*,tf::Graph_const*>,std::allocator<std::pair<tf::Node_const*,tf::Graph_const*>>>
  *local_58;
  Graph *local_50;
  Dumper *local_48;
  Taskflow *local_40;
  pointer local_38;
  
  local_38 = (graph->
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ).
             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (local_38 !=
      (graph->
      super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ).
      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_60 = (_Map_base<const_tf::Graph_*,_std::pair<const_tf::Graph_*const,_unsigned_long>,_std::allocator<std::pair<const_tf::Graph_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_tf::Graph_*>,_std::hash<const_tf::Graph_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&dumper->visited;
    local_58 = (deque<std::pair<tf::Node_const*,tf::Graph_const*>,std::allocator<std::pair<tf::Node_const*,tf::Graph_const*>>>
                *)&dumper->stack;
    local_50 = graph;
    local_48 = dumper;
    local_40 = this;
    do {
      node = (local_38->_M_t).super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
             super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
             super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
      if (*(__index_type *)
           ((long)&(node->_handle).
                   super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           + 0x38) == '\x06') {
        local_78 = *(key_type *)
                    &(node->_handle).
                     super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                     .
                     super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
        ;
        local_70.first = (Node *)CONCAT71(local_70.first._1_7_,0x70);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_70,1);
        poVar5 = std::ostream::_M_insert<void_const*>(poVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"[shape=box3d, color=blue, label=\"",0x21);
        sVar1 = (node->_name)._M_string_length;
        if (sVar1 == 0) {
          local_70.first = (Node *)CONCAT71(local_70.first._1_7_,0x70);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_70,1);
          std::ostream::_M_insert<void_const*>(poVar5);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    (os,(node->_name)._M_dataplus._M_p,sVar1);
        }
        uVar10 = (dumper->visited)._M_h._M_bucket_count;
        uVar8 = (ulong)local_78 % uVar10;
        p_Var2 = (dumper->visited)._M_h._M_buckets[uVar8];
        p_Var6 = (__node_base_ptr)0x0;
        if ((p_Var2 != (__node_base_ptr)0x0) &&
           (p_Var6 = p_Var2, p_Var9 = p_Var2->_M_nxt, local_78 != (key_type)p_Var2->_M_nxt[1]._M_nxt
           )) {
          while (p_Var3 = p_Var9->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
            p_Var6 = (__node_base_ptr)0x0;
            if (((ulong)p_Var3[1]._M_nxt % uVar10 != uVar8) ||
               (p_Var6 = p_Var9, p_Var9 = p_Var3, local_78 == (key_type)p_Var3[1]._M_nxt))
            goto LAB_0010f4f1;
          }
          p_Var6 = (__node_base_ptr)0x0;
        }
LAB_0010f4f1:
        if ((p_Var6 == (__node_base_ptr)0x0) || (p_Var6->_M_nxt == (_Hash_node_base *)0x0)) {
          mVar4 = dumper->id;
          dumper->id = mVar4 + 1;
          pmVar7 = std::__detail::
                   _Map_base<const_tf::Graph_*,_std::pair<const_tf::Graph_*const,_unsigned_long>,_std::allocator<std::pair<const_tf::Graph_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_tf::Graph_*>,_std::hash<const_tf::Graph_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[](local_60,&local_78);
          *pmVar7 = mVar4;
          local_70.second = local_78;
          local_70.first = node;
          std::
          deque<std::pair<tf::Node_const*,tf::Graph_const*>,std::allocator<std::pair<tf::Node_const*,tf::Graph_const*>>>
          ::emplace_back<std::pair<tf::Node_const*,tf::Graph_const*>>(local_58,&local_70);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os," [m",3);
        std::__detail::
        _Map_base<const_tf::Graph_*,_std::pair<const_tf::Graph_*const,_unsigned_long>,_std::allocator<std::pair<const_tf::Graph_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_tf::Graph_*>,_std::hash<const_tf::Graph_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
        ::operator[](local_60,&local_78);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)os);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]\"];\n",5);
        graph = local_50;
        dumper = local_48;
        if (node->_num_successors != 0) {
          uVar10 = 0;
          do {
            local_70.first._0_1_ = 0x70;
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_70,1);
            poVar5 = std::ostream::_M_insert<void_const*>(poVar5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"->",2);
            local_70.first = (Node *)CONCAT71(local_70.first._1_7_,0x70);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_70,1);
            poVar5 = std::ostream::_M_insert<void_const*>(poVar5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,";\n",2);
            uVar10 = uVar10 + 1;
            graph = local_50;
            dumper = local_48;
          } while (uVar10 < node->_num_successors);
        }
      }
      else {
        _dump(local_40,os,node,dumper);
      }
      local_38 = local_38 + 1;
    } while (local_38 !=
             (graph->
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ).
             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

inline void Taskflow::_dump(
  std::ostream& os, const Graph* graph, Dumper& dumper
) const {

  for(auto itr = graph->begin(); itr != graph->end(); ++itr) {

    Node* n = itr->get();

    // regular task
    if(n->_handle.index() != Node::MODULE) {
      _dump(os, n, dumper);
    }
    // module task
    else {
      //auto module = &(std::get_if<Node::Module>(&n->_handle)->module);
      auto module = &(std::get_if<Node::Module>(&n->_handle)->graph);

      os << 'p' << n << "[shape=box3d, color=blue, label=\"";
      if(n->_name.empty()) os << 'p' << n;
      else os << n->_name;

      if(dumper.visited.find(module) == dumper.visited.end()) {
        dumper.visited[module] = dumper.id++;
        dumper.stack.push({n, module});
      }

      os << " [m" << dumper.visited[module] << "]\"];\n";

      //for(const auto s : n->_successors) {
      for(size_t i=0; i<n->_num_successors; ++i) {
        os << 'p' << n << "->" << 'p' << n->_edges[i] << ";\n";
      }
    }
  }
}